

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool google::GetCommandLineOption(char *name,string *value)

{
  CommandLineFlag local_68 [32];
  undefined4 local_48;
  CommandLineFlag *local_38;
  CommandLineFlag *flag;
  FlagRegistryLock frl;
  FlagRegistry *registry;
  string *value_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._7_1_ = false;
  }
  else {
    if (value == (string *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x624,"bool google::GetCommandLineOption(const char *, string *)");
    }
    frl.fr_ = anon_unknown_1::FlagRegistry::GlobalRegistry();
    anon_unknown_1::FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&flag,frl.fr_);
    local_38 = anon_unknown_1::FlagRegistry::FindFlagLocked(frl.fr_,name);
    name_local._7_1_ = local_38 != (CommandLineFlag *)0x0;
    if (name_local._7_1_) {
      (anonymous_namespace)::CommandLineFlag::current_value_abi_cxx11_(local_68);
      std::__cxx11::string::operator=((string *)value,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
    }
    local_48 = 1;
    anon_unknown_1::FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&flag);
  }
  return name_local._7_1_;
}

Assistant:

bool GetCommandLineOption(const char* name, string* value) {
  if (NULL == name)
    return false;
  assert(value);

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag == NULL) {
    return false;
  } else {
    *value = flag->current_value();
    return true;
  }
}